

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_modelWithCnUnitsNotDefinedInImportedComponent_Test::TestBody
          (ModelFlattening_modelWithCnUnitsNotDefinedInImportedComponent_Test *this)

{
  char cVar1;
  char *pcVar2;
  unsigned_long local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  AssertionResult gtest_ar;
  AssertHelper local_68 [8];
  AssertionResult gtest_ar_;
  ImporterPtr importer;
  ModelPtr model;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"modelflattening/SN_to_cAMP/SN_to_cAMP.cellml",
             (allocator<char> *)&importer);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  libcellml::Importer::create(SUB81(&importer,0));
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_98 = libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->errorCount()",(unsigned_long *)&gtest_ar_,
             &local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x775,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cVar1 = libcellml::Model::hasUnresolvedImports();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = (bool)cVar1;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x776,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"modelflattening/SN_to_cAMP",(allocator<char> *)&local_98);
  resourcePath((string *)&gtest_ar);
  libcellml::Importer::resolveImports
            ((shared_ptr *)
             importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  cVar1 = libcellml::Model::hasUnresolvedImports();
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,cVar1) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x77a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar);
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  local_98 = libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(1)","importer->errorCount()",(unsigned_long *)&gtest_ar_,
             &local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x77e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Logger::error((ulong)&local_98);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[32],std::__cxx11::string>
            ((internal *)&gtest_ar_,"\"The model is not fully defined.\"",
             "importer->error(0)->description()",(char (*) [32])"The model is not fully defined.",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x77f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(ModelFlattening, modelWithCnUnitsNotDefinedInImportedComponent)
{
    auto parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("modelflattening/SN_to_cAMP/SN_to_cAMP.cellml"));
    auto importer = libcellml::Importer::create(false);

    EXPECT_EQ(size_t(0), parser->errorCount());
    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath("modelflattening/SN_to_cAMP"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    model = importer->flattenModel(model);

    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ("The model is not fully defined.", importer->error(0)->description());
}